

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void writeWaveHeader(FILE *outFile,WaveFmt *fmt,uint32_t dataLength)

{
  fwrite("RIFF",4,1,(FILE *)outFile);
  writeLengthField(outFile,dataLength + 0x24);
  fwrite("WAVE",4,1,(FILE *)outFile);
  fwrite("fmt ",4,1,(FILE *)outFile);
  writeLengthField(outFile,0x10);
  fwrite(fmt,0x10,1,(FILE *)outFile);
  fwrite("data",4,1,(FILE *)outFile);
  writeLengthField(outFile,dataLength);
  return;
}

Assistant:

void writeWaveHeader(FILE* outFile, struct WaveFmt *fmt, uint32_t dataLength){
	fwrite("RIFF", 4, 1, outFile);
	writeLengthField(outFile, 4 + 24 /*fmt chunk*/ + 8 + dataLength);
	fwrite("WAVE", 4, 1, outFile);
	fwrite("fmt ", 4, 1, outFile);
	writeLengthField(outFile, 16);
	fwrite(fmt, 16, 1, outFile);
	fwrite("data", 4, 1, outFile);
	writeLengthField(outFile, dataLength);
}